

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# promise.h
# Opt level: O0

void __thiscall Promise::Resolve(Promise *this,shared_ptr<Promise> *next)

{
  undefined8 uVar1;
  bool bVar2;
  element_type *peVar3;
  __shared_ptr_access<Promise,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  shared_ptr<Promise> *child;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<Promise>,_std::allocator<std::shared_ptr<Promise>_>_> *__range1;
  shared_ptr<Promise> local_38;
  undefined1 local_28 [24];
  shared_ptr<Promise> *next_local;
  Promise *this_local;
  
  local_28._16_8_ = next;
  next_local = (shared_ptr<Promise> *)this;
  std::shared_ptr<Promise>::shared_ptr(&local_38,next);
  Register((Promise *)local_28,&local_38);
  std::shared_ptr<Promise>::~shared_ptr((shared_ptr<Promise> *)local_28);
  std::shared_ptr<Promise>::~shared_ptr(&local_38);
  peVar3 = std::__shared_ptr_access<Promise,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Promise,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_28._16_8_);
  std::vector<std::shared_ptr<Promise>,_std::allocator<std::shared_ptr<Promise>_>_>::operator=
            (&peVar3->children,&this->children);
  __end1 = std::vector<std::shared_ptr<Promise>,_std::allocator<std::shared_ptr<Promise>_>_>::begin
                     (&this->children);
  child = (shared_ptr<Promise> *)
          std::vector<std::shared_ptr<Promise>,_std::allocator<std::shared_ptr<Promise>_>_>::end
                    (&this->children);
  while( true ) {
    bVar2 = __gnu_cxx::
            operator==<std::shared_ptr<Promise>_*,_std::vector<std::shared_ptr<Promise>,_std::allocator<std::shared_ptr<Promise>_>_>_>
                      (&__end1,(__normal_iterator<std::shared_ptr<Promise>_*,_std::vector<std::shared_ptr<Promise>,_std::allocator<std::shared_ptr<Promise>_>_>_>
                                *)&child);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    this_00 = (__shared_ptr_access<Promise,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              __gnu_cxx::
              __normal_iterator<std::shared_ptr<Promise>_*,_std::vector<std::shared_ptr<Promise>,_std::allocator<std::shared_ptr<Promise>_>_>_>
              ::operator*(&__end1);
    uVar1 = local_28._16_8_;
    peVar3 = std::__shared_ptr_access<Promise,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       (this_00);
    std::shared_ptr<Promise>::operator=(&peVar3->parent,(shared_ptr<Promise> *)uVar1);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<Promise>_*,_std::vector<std::shared_ptr<Promise>,_std::allocator<std::shared_ptr<Promise>_>_>_>
    ::operator++(&__end1);
  }
  std::vector<std::shared_ptr<Promise>,_std::allocator<std::shared_ptr<Promise>_>_>::clear
            (&this->children);
  std::vector<std::shared_ptr<Promise>,_std::allocator<std::shared_ptr<Promise>_>_>::push_back
            (&this->children,(value_type *)local_28._16_8_);
  Resolve(this);
  return;
}

Assistant:

void Resolve(const PromisePtr& next) {
    Register(next);

    next->children = children;
    for (auto& child : children) {
      child->parent = next;
    }
    children.clear();
    children.push_back(next);

    Resolve();
  }